

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = pX->nLTerm;
  uVar2 = pX->nSkip;
  uVar3 = pY->nSkip;
  iVar6 = 0;
  if ((int)((uint)uVar1 - (uint)uVar2) < (int)((uint)pY->nLTerm - (uint)uVar3)) {
    if (pY->rRun < pX->rRun) {
      if ((uVar3 <= uVar2) && (pX->nOut <= pY->nOut)) {
LAB_00192b71:
        if ((ulong)uVar1 != 0) {
          uVar7 = (ulong)uVar1;
          do {
            uVar8 = (ulong)pY->nLTerm;
            if (pX->aLTerm[uVar7 - 1] != (WhereTerm *)0x0) {
              do {
                if ((long)uVar8 < 1) {
                  return 0;
                }
                lVar5 = uVar8 - 1;
                uVar8 = uVar8 - 1;
              } while (pY->aLTerm[lVar5] != pX->aLTerm[uVar7 - 1]);
            }
            bVar4 = 1 < (long)uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar4);
        }
        if (((pX->wsFlags & 0x40) == 0) || ((pY->wsFlags & 0x40) != 0)) {
          iVar6 = 1;
        }
        return iVar6;
      }
    }
    else if (uVar3 <= uVar2) goto LAB_00192b71;
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0;
  if( pY->nSkip > pX->nSkip ) return 0;
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}